

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field,bool force_signed)

{
  BaseType BVar1;
  int iVar2;
  BaseType type;
  char *pcVar3;
  char *pcVar4;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "null";
    pcVar3 = "";
  }
  else {
    if (BVar1 - BASE_TYPE_FLOAT < 2) {
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (__return_storage_ptr__,
                 (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,field);
      if (BVar1 != BASE_TYPE_DOUBLE) {
        return __return_storage_ptr__;
      }
      if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          != 'f') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::pop_back();
      return __return_storage_ptr__;
    }
    if (BVar1 != BASE_TYPE_BOOL) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
      if (BVar1 == BASE_TYPE_LONG || !force_signed) {
        LiteralSuffix_abi_cxx11_(&local_48,(KotlinGenerator *)(ulong)BVar1,type);
        std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      std::operator+(__return_storage_ptr__,&(field->value).constant,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    iVar2 = std::__cxx11::string::compare((char *)&(field->value).constant);
    pcVar4 = "true";
    if (iVar2 == 0) {
      pcVar4 = "false";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = pcVar4 + (ulong)(iVar2 == 0) + 4;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field,
                              bool force_signed = false) const {
    auto &value = field.value;
    auto base_type = field.value.type.base_type;

    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    std::string suffix = "";

    if (base_type == BASE_TYPE_LONG || !force_signed) {
      suffix = LiteralSuffix(base_type);
    }
    return value.constant + suffix;
  }